

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_tracker_connection.cpp
# Opt level: O0

bool __thiscall
libtorrent::aux::http_tracker_connection::on_filter_hostname
          (http_tracker_connection *this,http_connection *param_1,string_view hostname)

{
  bool bVar1;
  session_settings *this_00;
  char *extraout_RDX;
  string_view hostname_00;
  session_settings *settings;
  http_connection *param_1_local;
  http_tracker_connection *this_local;
  string_view hostname_local;
  
  this_00 = tracker_manager::settings((this->super_tracker_connection).m_man);
  bVar1 = session_settings::get_bool(this_00,0x8051);
  if (bVar1) {
    hostname_local._M_str._7_1_ = true;
  }
  else {
    hostname_00._M_str = extraout_RDX;
    hostname_00._M_len = (size_t)hostname._M_str;
    bVar1 = is_idna((aux *)hostname._M_len,hostname_00);
    hostname_local._M_str._7_1_ = (bool)((bVar1 ^ 0xffU) & 1);
  }
  return hostname_local._M_str._7_1_;
}

Assistant:

bool http_tracker_connection::on_filter_hostname(aux::http_connection&
		, string_view hostname)
	{
		aux::session_settings const& settings = m_man.settings();
		if (settings.get_bool(settings_pack::allow_idna)) return true;
		return !is_idna(hostname);
	}